

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbkdf.c
# Opt level: O0

int kbkdf_set_ctx_params(void *vctx,OSSL_PARAM *params)

{
  OSSL_LIB_CTX *out;
  OSSL_PARAM *pOVar1;
  long in_RSI;
  OSSL_LIB_CTX *in_RDI;
  char *unaff_retaddr;
  OSSL_PARAM *p;
  OSSL_LIB_CTX *libctx;
  KBKDF *ctx;
  OSSL_PARAM *in_stack_ffffffffffffffc8;
  EVP_MAC *in_stack_ffffffffffffffd0;
  OSSL_LIB_CTX *libctx_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  libctx_00 = in_RDI;
  out = ossl_prov_ctx_get0_libctx((PROV_CTX *)in_RDI->lock);
  if (in_RSI == 0) {
    iVar2 = 1;
  }
  else {
    iVar2 = ossl_prov_macctx_load_from_params
                      ((EVP_MAC_CTX **)ctx,(OSSL_PARAM *)libctx,(char *)p,unaff_retaddr,
                       (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       libctx_00);
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      if ((in_RDI->data).sk != (stack_st_void *)0x0) {
        EVP_MAC_CTX_get0_mac((EVP_MAC_CTX *)(in_RDI->data).sk);
        iVar2 = EVP_MAC_is_a(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
        if (iVar2 == 0) {
          EVP_MAC_CTX_get0_mac((EVP_MAC_CTX *)(in_RDI->data).sk);
          iVar2 = EVP_MAC_is_a(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
          if (iVar2 == 0) {
            ERR_new();
            ERR_set_debug((char *)in_RDI,(int)((ulong)out >> 0x20),(char *)in_stack_ffffffffffffffd0
                         );
            ERR_set_error(0x39,0x97,(char *)0x0);
            return 0;
          }
        }
      }
      pOVar1 = OSSL_PARAM_locate_const
                         ((OSSL_PARAM *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8)
      ;
      if ((pOVar1 == (OSSL_PARAM *)0x0) ||
         (iVar2 = strncasecmp("counter",(char *)pOVar1->data,pOVar1->data_size), iVar2 != 0)) {
        if ((pOVar1 == (OSSL_PARAM *)0x0) ||
           (iVar2 = strncasecmp("feedback",(char *)pOVar1->data,pOVar1->data_size), iVar2 != 0)) {
          if (pOVar1 != (OSSL_PARAM *)0x0) {
            ERR_new();
            ERR_set_debug((char *)in_RDI,(int)((ulong)out >> 0x20),(char *)pOVar1);
            ERR_set_error(0x39,0x7d,(char *)0x0);
            return 0;
          }
          pOVar1 = (OSSL_PARAM *)0x0;
        }
        else {
          *(undefined4 *)&(in_RDI->data).ctx = 1;
        }
      }
      else {
        *(undefined4 *)&(in_RDI->data).ctx = 0;
      }
      pOVar1 = OSSL_PARAM_locate_const(pOVar1,(char *)in_stack_ffffffffffffffc8);
      if ((pOVar1 == (OSSL_PARAM *)0x0) ||
         (iVar2 = kbkdf_set_buffer((uchar **)out,(size_t *)pOVar1,in_stack_ffffffffffffffc8),
         iVar2 != 0)) {
        pOVar1 = OSSL_PARAM_locate_const(pOVar1,(char *)in_stack_ffffffffffffffc8);
        if ((pOVar1 == (OSSL_PARAM *)0x0) ||
           (iVar2 = kbkdf_set_buffer((uchar **)out,(size_t *)pOVar1,in_stack_ffffffffffffffc8),
           iVar2 != 0)) {
          pOVar1 = OSSL_PARAM_locate_const(pOVar1,(char *)in_stack_ffffffffffffffc8);
          if ((pOVar1 == (OSSL_PARAM *)0x0) ||
             (iVar2 = kbkdf_set_buffer((uchar **)out,(size_t *)pOVar1,in_stack_ffffffffffffffc8),
             iVar2 != 0)) {
            pOVar1 = OSSL_PARAM_locate_const(pOVar1,(char *)in_stack_ffffffffffffffc8);
            if ((pOVar1 == (OSSL_PARAM *)0x0) ||
               (iVar2 = kbkdf_set_buffer((uchar **)out,(size_t *)pOVar1,in_stack_ffffffffffffffc8),
               iVar2 != 0)) {
              pOVar1 = OSSL_PARAM_locate_const(pOVar1,(char *)in_stack_ffffffffffffffc8);
              if ((pOVar1 == (OSSL_PARAM *)0x0) ||
                 (iVar2 = OSSL_PARAM_get_int(pOVar1,(int *)in_stack_ffffffffffffffc8), iVar2 != 0))
              {
                pOVar1 = OSSL_PARAM_locate_const(pOVar1,(char *)in_stack_ffffffffffffffc8);
                if ((pOVar1 == (OSSL_PARAM *)0x0) ||
                   (iVar2 = OSSL_PARAM_get_int(pOVar1,(int *)in_stack_ffffffffffffffc8), iVar2 != 0)
                   ) {
                  if ((((in_RDI->data).sk == (stack_st_void *)0x0) ||
                      ((in_RDI->global).ex_data[0].meth == (stack_st_EX_CALLBACK *)0x0)) ||
                     (iVar2 = EVP_MAC_init((EVP_MAC_CTX *)in_RDI,(uchar *)out,(size_t)pOVar1,
                                           in_stack_ffffffffffffffc8), iVar2 != 0)) {
                    iVar2 = 1;
                  }
                  else {
                    iVar2 = 0;
                  }
                }
                else {
                  iVar2 = 0;
                }
              }
              else {
                iVar2 = 0;
              }
            }
            else {
              iVar2 = 0;
            }
          }
          else {
            iVar2 = 0;
          }
        }
        else {
          iVar2 = 0;
        }
      }
      else {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int kbkdf_set_ctx_params(void *vctx, const OSSL_PARAM params[])
{
    KBKDF *ctx = (KBKDF *)vctx;
    OSSL_LIB_CTX *libctx = PROV_LIBCTX_OF(ctx->provctx);
    const OSSL_PARAM *p;

    if (params == NULL)
        return 1;

    if (!ossl_prov_macctx_load_from_params(&ctx->ctx_init, params, NULL,
                                           NULL, NULL, libctx))
        return 0;
    else if (ctx->ctx_init != NULL
             && !EVP_MAC_is_a(EVP_MAC_CTX_get0_mac(ctx->ctx_init),
                              OSSL_MAC_NAME_HMAC)
             && !EVP_MAC_is_a(EVP_MAC_CTX_get0_mac(ctx->ctx_init),
                              OSSL_MAC_NAME_CMAC)) {
        ERR_raise(ERR_LIB_PROV, PROV_R_INVALID_MAC);
        return 0;
    }

    p = OSSL_PARAM_locate_const(params, OSSL_KDF_PARAM_MODE);
    if (p != NULL && strncasecmp("counter", p->data, p->data_size) == 0) {
        ctx->mode = COUNTER;
    } else if (p != NULL
               && strncasecmp("feedback", p->data, p->data_size) == 0) {
        ctx->mode = FEEDBACK;
    } else if (p != NULL) {
        ERR_raise(ERR_LIB_PROV, PROV_R_INVALID_MODE);
        return 0;
    }

    p = OSSL_PARAM_locate_const(params, OSSL_KDF_PARAM_KEY);
    if (p != NULL && !kbkdf_set_buffer(&ctx->ki, &ctx->ki_len, p))
        return 0;

    p = OSSL_PARAM_locate_const(params, OSSL_KDF_PARAM_SALT);
    if (p != NULL && !kbkdf_set_buffer(&ctx->label, &ctx->label_len, p))
        return 0;

    p = OSSL_PARAM_locate_const(params, OSSL_KDF_PARAM_INFO);
    if (p != NULL && !kbkdf_set_buffer(&ctx->context, &ctx->context_len, p))
        return 0;

    p = OSSL_PARAM_locate_const(params, OSSL_KDF_PARAM_SEED);
    if (p != NULL && !kbkdf_set_buffer(&ctx->iv, &ctx->iv_len, p))
        return 0;

    p = OSSL_PARAM_locate_const(params, OSSL_KDF_PARAM_KBKDF_USE_L);
    if (p != NULL && !OSSL_PARAM_get_int(p, &ctx->use_l))
        return 0;

    p = OSSL_PARAM_locate_const(params, OSSL_KDF_PARAM_KBKDF_USE_SEPARATOR);
    if (p != NULL && !OSSL_PARAM_get_int(p, &ctx->use_separator))
        return 0;

    /* Set up digest context, if we can. */
    if (ctx->ctx_init != NULL && ctx->ki_len != 0
            && !EVP_MAC_init(ctx->ctx_init, ctx->ki, ctx->ki_len, NULL))
            return 0;
    return 1;
}